

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall Js::InterpreterStackFrame::Process(InterpreterStackFrame *this)

{
  InterpreterStackFrame IVar1;
  InterpreterStackFrame IVar2;
  undefined4 uVar3;
  uint32 *puVar4;
  FunctionBody *this_00;
  code *pcVar5;
  ExecutionMode EVar6;
  bool bVar7;
  uint uVar8;
  Which WVar9;
  undefined4 *puVar10;
  Var pvVar11;
  void *pvVar12;
  char16 *pcVar13;
  EHBailoutData *ehBailoutData;
  double dVar14;
  AsmJsRetType local_98 [2];
  char16 debugStringBuffer [42];
  
  uVar3 = *(undefined4 *)(this + 0xd8);
  IVar1 = this[0xd6];
  puVar4 = *(uint32 **)(this + 0x150);
  if ((puVar4 != (uint32 *)0x0) && ((*(ushort *)(this + 0xd4) & 0x68) == 8)) {
    *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) | 0x20;
    ehBailoutData = *(EHBailoutData **)(this + 0x150);
    while (ehBailoutData->parent->nestingDepth != -1) {
      ehBailoutData->parent->child = ehBailoutData;
      ehBailoutData = ehBailoutData->parent;
    }
    ProcessTryHandlerBailout(this,ehBailoutData,*puVar4);
    this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xdf);
    *(undefined8 *)(this + 0x150) = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0) {
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7);
    *(undefined4 *)(this + 0xd8) = 0xffffffff;
    EVar6 = FunctionBody::GetInterpreterExecutionMode
                      (this_00,SUB41((*(ushort *)(this + 0xd4) & 8) >> 3,0));
    if (EVar6 != ProfilingInterpreter) {
      if (AutoProfilingInterpreter < EVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd95,
                                    "(interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter)"
                                    ,
                                    "interpreterExecutionMode == ExecutionMode::Interpreter || interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter"
                                   );
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      this[0xd6] = (InterpreterStackFrame)
                   ((byte)this[0xd6] & 0xef | (EVar6 == AutoProfilingInterpreter) << 4);
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_0098883e:
      if (((byte)this[0xd6] & 8) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xd9b,"(!switchProfileMode)","!switchProfileMode");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      pvVar11 = ProcessUnprofiled(this);
      if ((pvVar11 != (Var)0x0) && (((byte)this[0xd6] & 8) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xdaa,"(!(switchProfileMode && result))",
                                    "!(switchProfileMode && result)");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      IVar2 = this[0xd6];
      if (((byte)IVar2 & 8) == 0) goto LAB_00988ca6;
      this[0xd6] = (InterpreterStackFrame)((byte)IVar2 & 0xf7);
      if (((byte)IVar2 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xdb3,"(isAutoProfiling)","isAutoProfiling");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      uVar8 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
      if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015cd718,InterpreterAutoProfilePhase,uVar8,
                                ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
      if (bVar7) {
        pcVar13 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this_00,(wchar (*) [42])local_98);
        Output::Print(L"InterpreterAutoProfile - Func %s - Started profiling\n",pcVar13);
        Output::Flush();
      }
      if (((byte)this[0xd6] & 8) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xdbf,"(!switchProfileMode)","!switchProfileMode");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      pvVar11 = ProcessProfiled(this);
      if ((pvVar11 != (Var)0x0) && (((byte)this[0xd6] & 8) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xdc1,"(!(switchProfileMode && result))",
                                    "!(switchProfileMode && result)");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      IVar2 = this[0xd6];
      if (((byte)IVar2 & 8) == 0) goto LAB_00988ca6;
      this[0xd6] = (InterpreterStackFrame)((byte)IVar2 & 0xf7);
      if (((byte)IVar2 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xdca,"(isAutoProfiling)","isAutoProfiling");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      uVar8 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
      if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar7) goto LAB_00988cdf;
        *puVar10 = 0;
      }
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015cd718,InterpreterAutoProfilePhase,uVar8,
                                ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
      if (bVar7) {
        pcVar13 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this_00,(wchar (*) [42])local_98);
        Output::Print(L"InterpreterAutoProfile - Func %s - Stopped profiling\n",pcVar13);
        Output::Flush();
      }
      goto LAB_0098883e;
    }
    if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xd8c,
                                  "(!((this->scriptContext)->ShouldPerformRecordOrReplayDebuggerAction()))"
                                  ,"We should have pinned into Interpreter mode in this case!!!");
      if (!bVar7) goto LAB_00988cdf;
      *puVar10 = 0;
    }
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xef);
    pvVar11 = ProcessProfiled(this);
    goto LAB_00988ca6;
  }
  pvVar12 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,AsmJsFunctionInfo);
  if (pvVar12 == (void *)0x0) {
    pvVar12 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,AsmJsModuleInfo);
    if (pvVar12 == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xd7a,"(functionBody->GetAsmJsModuleInfo())",
                                  "functionBody->GetAsmJsModuleInfo()");
      if (!bVar7) goto LAB_00988cdf;
      *puVar10 = 0;
    }
    pvVar11 = ProcessAsmJsModule(this);
    goto LAB_00988ca6;
  }
  AlignMemoryForAsmJs(this);
  unique0x10000814 = pvVar12;
  pvVar11 = ProcessAsmJs(this);
  uVar8 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) {
LAB_00988cdf:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  bVar7 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsFunctionEntryPhase,uVar8,
                            ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                            .ptr)->functionId);
  if (!bVar7) goto LAB_00988ca6;
  AsmJsCallDepth = AsmJsCallDepth - 1;
  if (AsmJsCallDepth == 0) {
    Output::Print(L"}");
  }
  else {
    Output::Print(L"%*c}",(ulong)AsmJsCallDepth,0x20);
  }
  local_98[0].which_ = *(Type *)((long)stack0xffffffffffffffc0 + 0x84);
  WVar9 = AsmJsRetType::which(local_98);
  switch(WVar9) {
  case Int64:
    Output::Print(L" = %lld",**(undefined8 **)(this + 0x120));
    break;
  case Double:
    dVar14 = **(double **)(this + 0x128);
    goto LAB_00988c6c;
  case Float:
    dVar14 = (double)**(float **)(this + 0x130);
LAB_00988c6c:
    Output::Print(L" = %.4f",dVar14);
    break;
  case Signed:
    Output::Print(L" = %d",(ulong)**(uint **)(this + 0x118));
  }
  Output::Print(L";\n");
  Output::Flush();
LAB_00988ca6:
  this[0xd6] = (InterpreterStackFrame)
               (((byte)IVar1 >> 3 & 1) << 3 | (byte)this[0xd6] & 0xe7 | ((byte)IVar1 >> 4 & 1) << 4)
  ;
  *(undefined4 *)(this + 0xd8) = uVar3;
  return pvVar11;
}

Assistant:

Var InterpreterStackFrame::Process()
    {
#if ENABLE_PROFILE_INFO
        class AutoRestore
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            const uint32 savedSwitchProfileModeOnLoopEndNumber;
            const bool savedIsAutoProfiling;
            const bool savedSwitchProfileMode;

        public:
            AutoRestore(InterpreterStackFrame *const interpreterStackFrame)
                : interpreterStackFrame(interpreterStackFrame),
                savedIsAutoProfiling(interpreterStackFrame->isAutoProfiling),
                savedSwitchProfileMode(interpreterStackFrame->switchProfileMode),
                savedSwitchProfileModeOnLoopEndNumber(interpreterStackFrame->switchProfileModeOnLoopEndNumber)
            {
            }

            ~AutoRestore()
            {
                interpreterStackFrame->isAutoProfiling = savedIsAutoProfiling;
                interpreterStackFrame->switchProfileMode = savedSwitchProfileMode;
                interpreterStackFrame->switchProfileModeOnLoopEndNumber = savedSwitchProfileModeOnLoopEndNumber;
            }
        } autoRestore(this);
#endif

        if (this->ehBailoutData && !this->TestFlags(InterpreterStackFrameFlags_FromBailOutInInlinee))
        {
            if (this->TestFlags(Js::InterpreterStackFrameFlags_FromBailOut) && !this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutFromEHCode))
            {
                this->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                EHBailoutData * topLevelEHBailoutData = this->ehBailoutData;
                while (topLevelEHBailoutData->parent->nestingDepth != -1)
                {
                    topLevelEHBailoutData->parent->child = topLevelEHBailoutData;
                    topLevelEHBailoutData = topLevelEHBailoutData->parent;
                }
                ProcessTryHandlerBailout(topLevelEHBailoutData, this->ehBailoutData->nestingDepth);
                this->ClearFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutFromEHCode);
                this->ehBailoutData = nullptr;
            }
        }

#ifdef ASMJS_PLAT
        if (GetFunctionBody()->GetIsAsmjsMode())
        {
            FunctionBody *const functionBody = GetFunctionBody();
            AsmJsFunctionInfo* asmInfo = functionBody->GetAsmJsFunctionInfo();
            if (asmInfo)
            {
                AlignMemoryForAsmJs();
                Var returnVar = ProcessAsmJs();
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (PHASE_TRACE(AsmjsFunctionEntryPhase, functionBody))
                {
                    --AsmJsCallDepth;
                    if (AsmJsCallDepth)
                    {
                        Output::Print(_u("%*c}"), AsmJsCallDepth, ' ');
                    }
                    else
                    {
                        Output::Print(_u("}"));
                    }
                    switch (asmInfo->GetReturnType().which())
                    {
                    case AsmJsRetType::Void:
                        break;
                    case AsmJsRetType::Signed:
                        Output::Print(_u(" = %d"), m_localIntSlots[0]);
                        break;
                    case AsmJsRetType::Int64:
                        Output::Print(_u(" = %lld"), m_localInt64Slots[0]);
                        break;
                    case AsmJsRetType::Float:
                        Output::Print(_u(" = %.4f"), m_localFloatSlots[0]);
                        break;
                    case AsmJsRetType::Double:
                        Output::Print(_u(" = %.4f"), m_localDoubleSlots[0]);
                        break;
                    default:
                        break;
                    }
                    Output::Print(_u(";\n"));
                    Output::Flush();
                }
#endif
                return returnVar;
            }
            else
            {
                Assert(functionBody->GetAsmJsModuleInfo());
                return ProcessAsmJsModule();
            }
        }
#endif

#if ENABLE_PROFILE_INFO
        switchProfileMode = false;
        switchProfileModeOnLoopEndNumber = 0u - 1;
#endif

#if ENABLE_PROFILE_INFO
        FunctionBody *const functionBody = GetFunctionBody();
        const ExecutionMode interpreterExecutionMode =
            functionBody->GetInterpreterExecutionMode(TestFlags(InterpreterStackFrameFlags_FromBailOut));
        if (interpreterExecutionMode == ExecutionMode::ProfilingInterpreter)
        {
#if ENABLE_TTD
            AssertMsg(!SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext), "We should have pinned into Interpreter mode in this case!!!");
#endif

            isAutoProfiling = false;
            return ProcessProfiled();
        }

        Assert(
            interpreterExecutionMode == ExecutionMode::Interpreter ||
            interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter);
        isAutoProfiling = interpreterExecutionMode == ExecutionMode::AutoProfilingInterpreter;

        Var result;
        while (true)
        {
            Assert(!switchProfileMode);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
            if (this->scriptContext->ShouldPerformRecordOrReplayAction())
            {
                result = ProcessUnprofiled_PreviousStmtTracking();
            }
            else
            {
                result = ProcessUnprofiled();
            }
#else
            result = ProcessUnprofiled();
#endif

            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP

            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Started profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif

            Assert(!switchProfileMode);
            result = ProcessProfiled();
            Assert(!(switchProfileMode && result));
            if (switchProfileMode)
            {
                switchProfileMode = false;
            }
            else
            {
                break;
            }
            Assert(isAutoProfiling);

#if DBG_DUMP
            if (PHASE_TRACE(InterpreterAutoProfilePhase, functionBody))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("InterpreterAutoProfile - Func %s - Stopped profiling\n"), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }
#endif
        }
        return result;
#else
#if ENABLE_TTD_DIAGNOSTICS_TRACING
        if (this->scriptContext->ShouldPerformRecordOrReplayAction())
        {
            return ProcessUnprofiled_PreviousStmtTracking();
        }
        else
        {
            return ProcessUnprofiled();
        }
#else
        return ProcessUnprofiled();
#endif
#endif
    }